

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client.cpp
# Opt level: O1

bool __thiscall
miniros::ServiceClient::call
          (ServiceClient *this,SerializedMessage *req,SerializedMessage *resp,string *service_md5sum
          )

{
  element_type *peVar1;
  size_t __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ServiceManagerPtr *pSVar8;
  undefined1 local_58 [16];
  string local_48;
  
  peVar1 = (this->impl_).
           super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  __n = service_md5sum->_M_string_length;
  if ((__n != (peVar1->service_md5sum_)._M_string_length) ||
     ((__n != 0 &&
      (iVar7 = bcmp((service_md5sum->_M_dataplus)._M_p,(peVar1->service_md5sum_)._M_dataplus._M_p,
                    __n), iVar7 != 0)))) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (call::loc.initialized_ == false) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_58 + 0x10),"miniros.unknown_package","");
      console::initializeLogLocation(&call::loc,(string *)(local_58 + 0x10),Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    if (call::loc.level_ != Error) {
      call();
    }
    if (call::loc.logger_enabled_ == true) {
      call();
    }
    return false;
  }
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  if (peVar1->persistent_ == true) {
    if ((peVar1->server_link_).
        super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      pSVar8 = ServiceManager::instance();
      peVar1 = (this->impl_).
               super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ServiceManager::createServiceServerLink
                ((ServiceManager *)local_58,
                 (string *)
                 (pSVar8->super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr,(bool)((char)peVar1 + '\x10'),(string *)(ulong)peVar1->persistent_,
                 service_md5sum,(M_string *)service_md5sum);
      uVar3 = local_58._8_8_;
      uVar2 = local_58._0_8_;
      peVar1 = (this->impl_).
               super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58._0_4_ = 0;
      local_58._4_4_ = 0;
      local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (peVar1->server_link_).
                super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (peVar1->server_link_).
      super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar2;
      (peVar1->server_link_).
      super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
      if ((((this->impl_).
            super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          server_link_).super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) goto LAB_001fb62e;
    }
    peVar1 = (this->impl_).
             super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48._M_dataplus._M_p =
         (pointer)(peVar1->server_link_).
                  super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length,
               &(peVar1->server_link_).
                super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    pSVar8 = ServiceManager::instance();
    peVar1 = (this->impl_).
             super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ServiceManager::createServiceServerLink
              ((ServiceManager *)local_58,
               (string *)
               (pSVar8->super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,(bool)((char)peVar1 + '\x10'),(string *)(ulong)peVar1->persistent_,
               service_md5sum,(M_string *)service_md5sum);
    sVar4 = local_48._M_string_length;
    local_48._M_string_length = local_58._8_8_;
    local_48._M_dataplus._M_p = (pointer)local_58._0_8_;
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    if ((DurationBase<miniros::WallDuration>)local_48._M_dataplus._M_p ==
        (DurationBase<miniros::WallDuration>)0x0) {
LAB_001fb62e:
      bVar5 = false;
      goto LAB_001fb630;
    }
  }
  bVar5 = ServiceServerLink::call((ServiceServerLink *)local_48._M_dataplus._M_p,req,resp);
  sVar4 = local_48._M_string_length;
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4);
  }
  while ((bVar6 = isShuttingDown(), bVar6 && (bVar6 = ok(), bVar6))) {
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    DurationBase<miniros::WallDuration>::fromSec
              ((DurationBase<miniros::WallDuration> *)local_58,0.001);
    WallDuration::sleep((WallDuration *)local_58,(uint)req);
  }
LAB_001fb630:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
  }
  return bVar5;
}

Assistant:

bool ServiceClient::call(const SerializedMessage& req, SerializedMessage& resp, const std::string& service_md5sum)
{
  if (service_md5sum != impl_->service_md5sum_)
  {
    MINIROS_ERROR("Call to service [%s] with md5sum [%s] does not match md5sum when the handle was created ([%s])", impl_->name_.c_str(), service_md5sum.c_str(), impl_->service_md5sum_.c_str());

    return false;
  }

  ServiceServerLinkPtr link;

  if (impl_->persistent_)
  {
    if (!impl_->server_link_)
    {
      impl_->server_link_ = ServiceManager::instance()->createServiceServerLink(impl_->name_, impl_->persistent_, service_md5sum, service_md5sum, impl_->header_values_);

      if (!impl_->server_link_)
      {
        return false;
      }
    }

    link = impl_->server_link_;
  }
  else
  {
    link = ServiceManager::instance()->createServiceServerLink(impl_->name_, impl_->persistent_, service_md5sum, service_md5sum, impl_->header_values_);

    if (!link)
    {
      return false;
    }
  }

  bool ret = link->call(req, resp);
  link.reset();

  // If we're shutting down but the node haven't finished yet, wait until we do
  while (miniros::isShuttingDown() && miniros::ok())
  {
    miniros::WallDuration(0.001).sleep();
  }

  return ret;
}